

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O3

ON_wString Internal_VulgarFractionXator(int updown,ON_wString *X)

{
  int iVar1;
  wchar_t *pwVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ON_Internal_Empty_wString *pOVar6;
  ON_wString extraout_RAX;
  ON_wString extraout_RAX_00;
  ON_wString *in_RDX;
  undefined4 in_register_0000003c;
  ON__UINT32 cp0;
  ON_wString ator;
  ON_UnicodeErrorParameters e;
  ON__UINT32 u;
  ON_wString local_70;
  int local_68;
  int local_64;
  uint local_60;
  int local_5c;
  ON_wString *local_58;
  ON_wString *local_50;
  ON_wString local_48;
  ON_UnicodeErrorParameters local_40;
  
  local_50 = (ON_wString *)CONCAT44(in_register_0000003c,updown);
  local_68 = (int)X;
  if (local_68 != 0) {
    pwVar2 = in_RDX->m_s;
    pOVar6 = &empty_wstring;
    if (pwVar2 != (wchar_t *)0x0) {
      pOVar6 = (ON_Internal_Empty_wString *)(pwVar2 + -3);
    }
    iVar1 = (pOVar6->header).string_length;
    if (((0 < (long)iVar1) && (pwVar2 != (wchar_t *)0x0)) && (0 < (pOVar6->header).string_capacity))
    {
      local_58 = in_RDX;
      ON_wString::ON_wString(&local_70);
      ON_wString::ReserveArray(&local_70,(long)iVar1);
      iVar4 = 0;
      uVar3 = 0;
      do {
        local_60 = uVar3;
        local_40.m_error_code_point = ON_UnicodeErrorParameters::MaskErrors.m_error_code_point;
        local_40.m_error_status = ON_UnicodeErrorParameters::MaskErrors.m_error_status;
        local_40.m_error_mask = ON_UnicodeErrorParameters::MaskErrors.m_error_mask;
        u = 0x110000;
        local_5c = iVar4;
        local_64 = ON_DecodeWideChar(pwVar2 + iVar4,iVar1 - iVar4,&local_40,
                                     (ON__UINT32 *)&stack0xffffffffffffff8c);
        uVar5 = 0xfffd;
        if ((0 < local_64) && (iVar4 = ON_IsValidUnicodeCodePoint(u), iVar4 != 0)) {
          if (local_68 < 1) {
            uVar5 = ON_UnicodeSubcriptFromCodePoint(u,u);
          }
          else {
            uVar5 = ON_UnicodeSuperscriptFromCodePoint(u,u);
          }
        }
        ON_wString::FromUnicodeCodePoint(u);
        ON_wString::operator+=(&local_70,&local_48);
        iVar4 = local_64;
        ON_wString::~ON_wString(&local_48);
        if (iVar4 < 1) {
          iVar4 = 1;
        }
        iVar4 = local_5c + iVar4;
        uVar3 = CONCAT31((int3)(local_60 >> 8),(byte)local_60 | (uVar5 != 0xfffd && uVar5 != u));
      } while (iVar4 < iVar1);
      if ((local_60 & 1) != 0 || uVar5 != 0xfffd && uVar5 != u) {
        local_58 = &local_70;
      }
      ON_wString::ON_wString(local_50,local_58);
      ON_wString::~ON_wString(&local_70);
      return (ON_wString)extraout_RAX.m_s;
    }
    in_RDX = &ON_wString::EmptyString;
  }
  ON_wString::ON_wString(local_50,in_RDX);
  return (ON_wString)extraout_RAX_00.m_s;
}

Assistant:

static const ON_wString Internal_VulgarFractionXator(int updown, const ON_wString X)
{
  if (0 == updown)
    return X;

  const int len = X.Length();
  if (len <= 0)
    return ON_wString::EmptyString;
  const wchar_t* s0 = X.Array();
  if (nullptr == s0)
    return ON_wString::EmptyString;


  bool bReturnAtor = false;
  ON_wString ator;
  ator.ReserveArray(len);
  ON_UnicodeErrorParameters e;
  int delta = 0;
  for (int i = 0; i < len; i += ((delta > 0) ? delta : 1))
  {
    e = ON_UnicodeErrorParameters::MaskErrors;
    ON__UINT32 cp0 = ON_UnicodeCodePoint::ON_InvalidCodePoint;
    delta = ON_DecodeWideChar(s0 + i, len - i, &e, &cp0);
    ON__UINT32 cp1
      = (delta > 0 && ON_IsValidUnicodeCodePoint(cp0))
      ? (updown > 0 ? ON_UnicodeSuperscriptFromCodePoint(cp0,cp0) : ON_UnicodeSubcriptFromCodePoint(cp0,cp0))
      : ON_UnicodeCodePoint::ON_ReplacementCharacter;
    if (cp1 != cp0 && cp1 != ON_UnicodeCodePoint::ON_ReplacementCharacter)
      bReturnAtor = true;
    ator += ON_wString::FromUnicodeCodePoint(cp1);
  }

  return bReturnAtor ? ator : X;
}